

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Schema __thiscall capnp::SchemaLoader::getUnbound(SchemaLoader *this,uint64_t id)

{
  Reader brand;
  undefined1 auVar1 [40];
  Schema SVar2;
  RawBrandedSchema *pRVar3;
  MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> local_58;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  local_58.value.ptr = (Impl *)0x0;
  uStack_30 = 0;
  local_58.mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)0x0;
  local_58.value.disposer = (Disposer *)0x0;
  uStack_20 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  SVar2 = get(this,id,brand,(Schema)0x25d1d0);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            (&local_58,this);
  pRVar3 = Impl::getUnbound((Impl *)(local_58.mutex.waitersHead.ptr)->prev,(SVar2.raw)->generic);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&local_58);
  return (Schema)pRVar3;
}

Assistant:

Schema SchemaLoader::getUnbound(uint64_t id) const {
  auto schema = get(id);
  return Schema(impl.lockExclusive()->get()->getUnbound(schema.raw->generic));
}